

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O2

bool __thiscall
Assimp::AMFImporter::CanRead(AMFImporter *this,string *pFile,IOSystem *pIOHandler,bool pCheckSig)

{
  bool bVar1;
  bool bVar2;
  char *tokens [1];
  string extension;
  
  BaseImporter::GetExtension(&extension,pFile);
  bVar1 = std::operator==(&extension,"amf");
  bVar2 = true;
  if (!bVar1) {
    if (extension._M_string_length == 0 || pCheckSig) {
      tokens[0] = "<amf";
      bVar2 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,tokens,1,200,false,false);
    }
    else {
      bVar2 = false;
    }
  }
  std::__cxx11::string::~string((string *)&extension);
  return bVar2;
}

Assistant:

bool AMFImporter::CanRead(const std::string& pFile, IOSystem* pIOHandler, bool pCheckSig) const
{
    const std::string extension = GetExtension(pFile);

    if ( extension == "amf" ) {
        return true;
    }

	if(!extension.length() || pCheckSig)
	{
		const char* tokens[] = { "<amf" };

		return SearchFileHeaderForToken( pIOHandler, pFile, tokens, 1 );
	}

	return false;
}